

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O1

void nn_fsm_init(nn_fsm *self,nn_fsm_fn fn,nn_fsm_fn shutdown_fn,int src,void *srcptr,nn_fsm *owner)

{
  self->fn = fn;
  self->shutdown_fn = shutdown_fn;
  self->state = 1;
  self->src = src;
  self->srcptr = srcptr;
  self->owner = owner;
  self->ctx = owner->ctx;
  (self->stopped).fsm = (nn_fsm *)0x0;
  (self->stopped).src = -1;
  (self->stopped).srcptr = (void *)0x0;
  (self->stopped).type = -1;
  nn_queue_item_init(&(self->stopped).item);
  return;
}

Assistant:

void nn_fsm_init (struct nn_fsm *self, nn_fsm_fn fn,
    nn_fsm_fn shutdown_fn, int src, void *srcptr, struct nn_fsm *owner)
{
    self->fn = fn;
    self->shutdown_fn = shutdown_fn;
    self->state = NN_FSM_STATE_IDLE;
    self->src = src;
    self->srcptr = srcptr;
    self->owner = owner;
    self->ctx = owner->ctx;
    nn_fsm_event_init (&self->stopped);
}